

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  int iVar9;
  char cVar10;
  numpunct *pnVar11;
  ulong uVar12;
  buffer_appender<char> bVar13;
  long *plVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  buffer<char> *buf;
  ulong uVar18;
  long lVar19;
  long *plVar20;
  uint uVar21;
  char *pcVar23;
  ulong uVar24;
  char *pcVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  string groups;
  char digits [40];
  long *local_298;
  long local_290;
  long local_288;
  char acStack_27a [50];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong uVar22;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_298,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_290 == 0) {
    on_dec(this);
  }
  else {
    plVar5 = (locale *)(this->locale).locale_;
    if (plVar5 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar5);
    }
    pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar10 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
    std::locale::~locale((locale *)&local_248);
    if (cVar10 != '\0') {
      puVar1 = &this->abs_value;
      uVar26 = (ulong)*puVar1;
      uVar12 = *(ulong *)((long)&this->abs_value + 8);
      auVar8 = (undefined1  [16])*puVar1;
      auVar28 = (undefined1  [16])*puVar1;
      uVar24 = 1;
      if ((uVar26 < 10) <= uVar12) {
        uVar24 = 4;
        auVar27 = auVar28;
        do {
          uVar22 = auVar27._8_8_;
          uVar18 = auVar27._0_8_;
          iVar16 = (int)uVar24;
          if (uVar22 == 0 && (ulong)(99 < uVar18) <= -uVar22) {
            uVar24 = (ulong)(iVar16 - 2);
            goto LAB_0011c864;
          }
          if (uVar22 == 0 && (ulong)(999 < uVar18) <= -uVar22) {
            uVar24 = (ulong)(iVar16 - 1);
            goto LAB_0011c864;
          }
          if (uVar22 < (uVar18 < 10000)) goto LAB_0011c864;
          auVar27 = __udivti3(uVar18,uVar22,10000,0);
          uVar24 = (ulong)(iVar16 + 4);
        } while (uVar22 != 0 || -uVar22 < (ulong)(99999 < uVar18));
        uVar24 = (ulong)(iVar16 + 1);
      }
LAB_0011c864:
      plVar20 = (long *)((long)local_298 + local_290);
      uVar7 = (uint)uVar24;
      plVar14 = local_298;
      uVar18 = uVar24;
      uVar17 = uVar7;
      if (local_290 != 0) {
        lVar19 = local_290;
        uVar22 = uVar24;
        do {
          uVar17 = (uint)uVar22;
          cVar3 = (char)*plVar14;
          uVar21 = uVar17 - (int)cVar3;
          uVar22 = (ulong)uVar21;
          if ((uVar21 == 0 || (int)uVar17 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
          goto LAB_0011c8b4;
          uVar18 = (ulong)((int)uVar18 + 1);
          plVar14 = (long *)((long)plVar14 + 1);
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        plVar14 = plVar20;
        uVar18 = (ulong)(uVar7 + (int)local_290);
        uVar17 = uVar21;
      }
LAB_0011c8b4:
      iVar16 = (int)uVar18;
      if (plVar14 == plVar20) {
        iVar16 = iVar16 + (int)(uVar17 - 1) / (int)*(char *)((long)plVar20 + -1);
      }
      iVar15 = 1;
      if ((uVar26 < 10) <= uVar12) {
        iVar9 = 4;
        auVar27 = auVar28;
        do {
          iVar15 = iVar9;
          uVar22 = auVar27._8_8_;
          uVar18 = auVar27._0_8_;
          if (uVar22 == 0 && (ulong)(99 < uVar18) <= -uVar22) {
            iVar15 = iVar15 + -2;
            goto LAB_0011c958;
          }
          if (uVar22 == 0 && (ulong)(999 < uVar18) <= -uVar22) {
            iVar15 = iVar15 + -1;
            goto LAB_0011c958;
          }
          if (uVar22 < (uVar18 < 10000)) goto LAB_0011c958;
          auVar27 = __udivti3(uVar18,uVar22,10000,0);
          iVar9 = iVar15 + 4;
        } while (uVar22 != 0 || -uVar22 < (ulong)(99999 < uVar18));
        iVar15 = iVar15 + 1;
      }
LAB_0011c958:
      if ((int)uVar7 < iVar15) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/format.h"
                    ,0x41b,"invalid digit count");
      }
      pcVar25 = acStack_27a + (long)(int)uVar7 + 2;
      pcVar23 = pcVar25;
      if ((uVar26 < 100) <= uVar12) {
        do {
          lVar19 = auVar28._8_8_;
          uVar26 = auVar28._0_8_;
          pcVar25 = pcVar23 + -2;
          auVar28 = __udivti3(uVar26,lVar19,100,0);
          *(undefined2 *)(pcVar23 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar26 + auVar28._0_8_ * -100) * 2);
          pcVar23 = pcVar25;
          auVar8 = auVar28;
        } while (lVar19 != 0 || (ulong)-lVar19 < (ulong)(9999 < uVar26));
      }
      if (auVar8._8_8_ == 0 && (ulong)(9 < auVar8._0_8_) <= (ulong)-auVar8._8_8_) {
        pcVar25[-1] = auVar8[0] | 0x30;
      }
      else {
        *(undefined2 *)(pcVar25 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar8._0_8_ * 2)
        ;
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00147e78;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar17 = iVar16 + this->prefix_size;
      if (-1 < (int)uVar17) {
        uVar26 = (ulong)uVar17;
        if (500 < uVar17) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar26);
        }
        pcVar25 = local_248.super_buffer<char>.ptr_;
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar26 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar26;
        }
        pcVar23 = local_248.super_buffer<char>.ptr_ + (uVar26 - 1);
        if (1 < (int)uVar7) {
          lVar19 = uVar24 + 1;
          iVar16 = 0;
          plVar20 = local_298;
          do {
            pcVar2 = pcVar23 + -1;
            *pcVar23 = acStack_27a[lVar19];
            cVar3 = (char)*plVar20;
            if ('\0' < cVar3) {
              iVar16 = iVar16 + 1;
              if ((cVar3 != '\x7f') && (iVar16 % (int)cVar3 == 0)) {
                if ((long *)((long)plVar20 + 1) != (long *)((long)local_298 + local_290)) {
                  iVar16 = 0;
                  plVar20 = (long *)((long)plVar20 + 1);
                }
                pcVar23[-1] = cVar10;
                pcVar2 = pcVar23 + -2;
              }
            }
            pcVar23 = pcVar2;
            lVar19 = lVar19 + -1;
          } while (2 < lVar19);
        }
        *pcVar23 = acStack_27a[2];
        if (this->prefix_size != 0) {
          pcVar23[-1] = '-';
        }
        pbVar6 = this->specs;
        uVar12 = (ulong)pbVar6->width;
        if (-1 < (long)uVar12) {
          uVar24 = 0;
          if (uVar26 <= uVar12) {
            uVar24 = uVar12 - uVar26;
          }
          bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar6->field_0x9 & 0xf));
          if (*(ulong *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar26 + (pbVar6->fill).size_ * uVar24) {
            (*(code *)**(undefined8 **)
                        bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar12 = uVar24 >> (bVar4 & 0x3f);
          bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar13,uVar12,&pbVar6->fill);
          bVar13 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar25,pcVar25 + uVar26,bVar13);
          bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar13,uVar24 - uVar12,&pbVar6->fill);
          (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_0011cbb4;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_0011cbb4:
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }